

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdata.cpp
# Opt level: O0

int32_t __thiscall
icu_63::CollationData::addHighScriptRange
          (CollationData *this,uint8_t *table,int32_t index,int32_t highLimit)

{
  ushort uVar1;
  uint uVar2;
  int32_t start;
  int32_t limit;
  int32_t highLimit_local;
  int32_t index_local;
  uint8_t *table_local;
  CollationData *this_local;
  
  start = highLimit;
  if ((highLimit & 0xffU) < (this->scriptStarts[index + 1] & 0xff)) {
    start = highLimit + -0x100;
  }
  uVar1 = this->scriptStarts[index];
  uVar2 = (start & 0xff00U) - ((this->scriptStarts[index + 1] & 0xff00) - (uVar1 & 0xff00));
  table[index] = (uint8_t)(uVar2 >> 8);
  return uVar2 | uVar1 & 0xff;
}

Assistant:

int32_t
CollationData::addHighScriptRange(uint8_t table[], int32_t index, int32_t highLimit) const {
    int32_t limit = scriptStarts[index + 1];
    if((limit & 0xff) > (highLimit & 0xff)) {
        highLimit -= 0x100;
    }
    int32_t start = scriptStarts[index];
    highLimit = ((highLimit & 0xff00) - ((limit & 0xff00) - (start & 0xff00))) | (start & 0xff);
    table[index] = (uint8_t)(highLimit >> 8);
    return highLimit;
}